

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

FlatView * generate_memory_topology(uc_struct_conflict15 *uc,MemoryRegion_conflict *mr)

{
  long *plVar1;
  FlatRange *pFVar2;
  ulong uVar3;
  long lVar4;
  AddrRange clip;
  Int128 IVar5;
  uint uVar6;
  FlatView *view;
  char *pcVar7;
  AddressSpaceDispatch *pAVar8;
  Int128 *pIVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  MemoryRegionSection mrs;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  MemoryRegionSection local_78;
  
  view = (FlatView *)g_malloc0(0x28);
  view->ref = 1;
  view->root = (MemoryRegion *)mr;
  if (mr != (MemoryRegion_conflict *)0x0) {
    clip.size._0_8_ = in_stack_ffffffffffffff58;
    clip.start = (Int128)(ZEXT816(1) << 0x40);
    clip.size._8_8_ = in_stack_ffffffffffffff60;
    render_memory_region(view,mr,(Int128)ZEXT816(0),clip,false);
  }
  uVar16 = (ulong)view->nr;
  if (view->nr != 0) {
    uVar14 = 1;
    lVar15 = 0x70;
    uVar10 = 0;
    do {
      uVar11 = uVar10 + 1;
      uVar13 = uVar11 & 0xffffffff;
      if (uVar11 < uVar16) {
        pFVar2 = view->ranges;
        pIVar9 = &pFVar2[uVar10].addr.size;
        pcVar7 = (char *)((long)&pFVar2->mr + lVar15);
        uVar12 = uVar14;
        do {
          uVar3 = *(ulong *)(pcVar7 + -0x50);
          uVar13 = uVar12;
          if ((((*(long *)(pcVar7 + -0x58) + *(long *)(pcVar7 + -0x48) +
                 (ulong)CARRY8(*(ulong *)(pcVar7 + -0x60),uVar3) != *(long *)(pcVar7 + -0x18) ||
                 *(ulong *)(pcVar7 + -0x60) + uVar3 != *(long *)(pcVar7 + -0x20)) ||
               (*(long *)(pcVar7 + -0x70) != *(long *)(pcVar7 + -0x30))) ||
              (uVar3 + *(ulong *)(pcVar7 + -0x68) != *(long *)(pcVar7 + -0x28) ||
               *(long *)(pcVar7 + -0x48) + (ulong)CARRY8(uVar3,*(ulong *)(pcVar7 + -0x68)) != 0)) ||
             (pcVar7[-0x40] != *pcVar7)) break;
          uVar13 = *(ulong *)(pcVar7 + -0x10);
          lVar4 = *(long *)(pcVar7 + -8);
          IVar5 = *pIVar9;
          *(ulong *)pIVar9 = (long)*pIVar9 + uVar13;
          plVar1 = (long *)((long)&pFVar2[uVar10].addr.size + 8);
          *plVar1 = *plVar1 + lVar4 + (ulong)CARRY8((ulong)IVar5,uVar13);
          uVar12 = uVar12 + 1;
          pcVar7 = pcVar7 + 0x40;
          uVar13 = uVar16;
        } while (uVar16 != uVar12);
      }
      memmove(view->ranges + uVar11,view->ranges + (uVar13 & 0xffffffff),
              (ulong)(uint)((int)uVar16 - (int)uVar13) << 6);
      uVar6 = ((int)uVar11 - (int)uVar13) + view->nr;
      uVar16 = (ulong)uVar6;
      view->nr = uVar6;
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x40;
      uVar10 = uVar11;
    } while (uVar11 < uVar16);
  }
  pAVar8 = address_space_dispatch_new_tricore(uc,view);
  view->dispatch = pAVar8;
  if (view->nr != 0) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      pFVar2 = view->ranges;
      local_78.size._0_8_ = *(undefined8 *)((long)&(pFVar2->addr).size + lVar15);
      local_78.size._8_8_ = *(undefined8 *)((long)&(pFVar2->addr).size + lVar15 + 8);
      local_78.mr = *(MemoryRegion **)((long)&pFVar2->mr + lVar15);
      local_78.offset_within_region = *(hwaddr *)((long)&pFVar2->offset_in_region + lVar15);
      local_78.fv = view;
      if (*(long *)((long)&(pFVar2->addr).start + lVar15 + 8) != 0) {
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      local_78.offset_within_address_space = *(hwaddr *)((long)&(pFVar2->addr).start + lVar15);
      local_78.readonly = (&pFVar2->readonly)[lVar15];
      flatview_add_to_dispatch_tricore(uc,view,&local_78);
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x40;
    } while (uVar16 < view->nr);
  }
  address_space_dispatch_compact_tricore(view->dispatch);
  g_hash_table_replace(uc->flat_views,mr,view);
  return view;
}

Assistant:

static FlatView *generate_memory_topology(struct uc_struct *uc, MemoryRegion *mr)
{
    int i;
    FlatView *view;

    view = flatview_new(mr);

    if (mr) {
        render_memory_region(view, mr, int128_zero(),
                             addrrange_make(int128_zero(), int128_2_64()),
                             false);
    }
    flatview_simplify(view);

    view->dispatch = address_space_dispatch_new(uc, view);
    for (i = 0; i < view->nr; i++) {
        MemoryRegionSection mrs =
            section_from_flat_range(&view->ranges[i], view);
        flatview_add_to_dispatch(uc, view, &mrs);
    }
    address_space_dispatch_compact(view->dispatch);
    g_hash_table_replace(uc->flat_views, mr, view);

    return view;
}